

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000019f450 = 0x2d2d2d2d2d2d2d;
    uRam000000000019f457._0_1_ = '-';
    uRam000000000019f457._1_1_ = '-';
    uRam000000000019f457._2_1_ = '-';
    uRam000000000019f457._3_1_ = '-';
    uRam000000000019f457._4_1_ = '-';
    uRam000000000019f457._5_1_ = '-';
    uRam000000000019f457._6_1_ = '-';
    uRam000000000019f457._7_1_ = '-';
    DAT_0019f440 = '-';
    DAT_0019f440_1._0_1_ = '-';
    DAT_0019f440_1._1_1_ = '-';
    DAT_0019f440_1._2_1_ = '-';
    DAT_0019f440_1._3_1_ = '-';
    DAT_0019f440_1._4_1_ = '-';
    DAT_0019f440_1._5_1_ = '-';
    DAT_0019f440_1._6_1_ = '-';
    uRam000000000019f448 = 0x2d2d2d2d2d2d2d;
    DAT_0019f44f = 0x2d;
    DAT_0019f430 = '-';
    DAT_0019f430_1._0_1_ = '-';
    DAT_0019f430_1._1_1_ = '-';
    DAT_0019f430_1._2_1_ = '-';
    DAT_0019f430_1._3_1_ = '-';
    DAT_0019f430_1._4_1_ = '-';
    DAT_0019f430_1._5_1_ = '-';
    DAT_0019f430_1._6_1_ = '-';
    uRam000000000019f438._0_1_ = '-';
    uRam000000000019f438._1_1_ = '-';
    uRam000000000019f438._2_1_ = '-';
    uRam000000000019f438._3_1_ = '-';
    uRam000000000019f438._4_1_ = '-';
    uRam000000000019f438._5_1_ = '-';
    uRam000000000019f438._6_1_ = '-';
    uRam000000000019f438._7_1_ = '-';
    DAT_0019f420 = '-';
    DAT_0019f420_1._0_1_ = '-';
    DAT_0019f420_1._1_1_ = '-';
    DAT_0019f420_1._2_1_ = '-';
    DAT_0019f420_1._3_1_ = '-';
    DAT_0019f420_1._4_1_ = '-';
    DAT_0019f420_1._5_1_ = '-';
    DAT_0019f420_1._6_1_ = '-';
    uRam000000000019f428._0_1_ = '-';
    uRam000000000019f428._1_1_ = '-';
    uRam000000000019f428._2_1_ = '-';
    uRam000000000019f428._3_1_ = '-';
    uRam000000000019f428._4_1_ = '-';
    uRam000000000019f428._5_1_ = '-';
    uRam000000000019f428._6_1_ = '-';
    uRam000000000019f428._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000019f418._0_1_ = '-';
    uRam000000000019f418._1_1_ = '-';
    uRam000000000019f418._2_1_ = '-';
    uRam000000000019f418._3_1_ = '-';
    uRam000000000019f418._4_1_ = '-';
    uRam000000000019f418._5_1_ = '-';
    uRam000000000019f418._6_1_ = '-';
    uRam000000000019f418._7_1_ = '-';
    DAT_0019f45f = 0;
  }
  uStack_18 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}